

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.c
# Opt level: O0

void array_container_copy(array_container_t *src,array_container_t *dst)

{
  int iVar1;
  int *in_RSI;
  int *in_RDI;
  int32_t cardinality;
  array_container_t *unaff_retaddr;
  
  iVar1 = *in_RDI;
  if (in_RSI[1] < iVar1) {
    array_container_grow
              (unaff_retaddr,(int32_t)((ulong)in_RDI >> 0x20),SUB81((ulong)in_RDI >> 0x18,0));
  }
  *in_RSI = iVar1;
  memcpy(*(void **)(in_RSI + 2),*(void **)(in_RDI + 2),(long)iVar1 << 1);
  return;
}

Assistant:

void array_container_copy(const array_container_t *src,
                          array_container_t *dst) {
    const int32_t cardinality = src->cardinality;
    if (cardinality > dst->capacity) {
        array_container_grow(dst, cardinality, false);
    }

    dst->cardinality = cardinality;
    memcpy(dst->array, src->array, cardinality * sizeof(uint16_t));
}